

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O3

parsing_result *
clipp::parse(parsing_result *__return_storage_ptr__,int argc,char **argv,group *cli,arg_index offset
            )

{
  pointer pcVar1;
  pointer pcVar2;
  child_t<clipp::parameter,_clipp::group> *pcVar3;
  pointer pmVar4;
  pointer paVar5;
  pointer paVar6;
  arg_string *paVar7;
  bool bVar8;
  arg_string *paVar9;
  long lVar10;
  pointer pcVar11;
  pointer pcVar12;
  parsing_result *__range2_1;
  arg_list *__range2;
  iterator __end2;
  const_iterator __begin2_1;
  ulong uVar13;
  pointer pcVar14;
  pointer pmVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *prv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  pointer arg_00;
  pointer this;
  pointer pbVar16;
  arg_list args;
  parser parse;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  missing_events local_158;
  vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_> local_138;
  parser local_118;
  
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (arg_string *)0x0;
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (arg_string *)0x0;
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (offset < argc) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::_M_assign_aux<char**>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_178,
               argv + offset,argv + argc);
    paVar7 = local_178.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
    pbVar16 = local_178.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 1 !=
        local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish &&
        local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        paVar9 = paVar7;
        if ((((paVar9 != local_178.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) &&
             (1 < pbVar16[1]._M_string_length)) &&
            (lVar10 = std::__cxx11::string::find((char)paVar9,0x2e), lVar10 == 0)) &&
           ((int)(paVar9->_M_dataplus)._M_p[1] - 0x30U < 10)) {
          pcVar1 = (pbVar16->_M_dataplus)._M_p;
          uVar13 = pbVar16->_M_string_length;
          pcVar12 = pcVar1 + uVar13;
          lVar10 = (long)uVar13 >> 2;
          pcVar11 = pcVar12;
          if (0 < lVar10) {
            pcVar11 = pcVar12 + -(uVar13 & 0xfffffffffffffffc);
            pcVar12 = pcVar12 + lVar10 * -4;
            lVar10 = lVar10 + 1;
            do {
              if ((int)pcVar1[uVar13 - 1] - 0x3aU < 0xfffffff6) {
                pcVar14 = pcVar1 + uVar13;
                goto LAB_001316bf;
              }
              if ((int)pcVar1[uVar13 - 2] - 0x3aU < 0xfffffff6) {
                pcVar14 = pcVar1 + (uVar13 - 1);
                goto LAB_001316bf;
              }
              if ((int)pcVar1[uVar13 - 3] - 0x3aU < 0xfffffff6) {
                pcVar14 = pcVar1 + (uVar13 - 2);
                goto LAB_001316bf;
              }
              if ((int)pcVar1[uVar13 - 4] - 0x3aU < 0xfffffff6) {
                pcVar14 = pcVar1 + (uVar13 - 3);
                goto LAB_001316bf;
              }
              uVar13 = uVar13 - 4;
              lVar10 = lVar10 + -1;
            } while (1 < lVar10);
          }
          lVar10 = (long)pcVar11 - (long)pcVar1;
          if (lVar10 == 1) {
LAB_0013168f:
            pcVar14 = pcVar11;
            if (0xfffffff5 < (int)pcVar11[-1] - 0x3aU) {
              pcVar14 = pcVar1;
            }
          }
          else if (lVar10 == 2) {
LAB_0013167a:
            pcVar14 = pcVar11;
            if (0xfffffff5 < (int)pcVar11[-1] - 0x3aU) {
              pcVar11 = pcVar12 + -1;
              goto LAB_0013168f;
            }
          }
          else {
            pcVar14 = pcVar1;
            if ((lVar10 == 3) && (pcVar14 = pcVar11, 0xfffffff5 < (int)pcVar11[-1] - 0x3aU)) {
              pcVar11 = pcVar12 + -1;
              pcVar12 = pcVar11;
              goto LAB_0013167a;
            }
          }
LAB_001316bf:
          if ((pcVar1 < pcVar14) && ((pcVar14[-1] == '-' || (pcVar14[-1] == '+')))) {
            pcVar14 = pcVar14 + -1;
          }
          std::__cxx11::string::replace((ulong)paVar9,0,(char *)0x0,(ulong)pcVar14);
          pbVar16->_M_string_length = (long)pcVar14 - (long)(pbVar16->_M_dataplus)._M_p;
          *pcVar14 = '\0';
        }
        paVar7 = paVar9 + 1;
        pbVar16 = paVar9;
      } while (paVar9 + 1 !=
               local_178.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  parser::parser(&local_118,cli,offset);
  pbVar16 = local_178.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_178.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_178.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    arg_00 = local_178.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      parser::operator()(&local_118,arg_00);
      if (local_118.pos_.pos_.stack_.
          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_118.pos_.pos_.stack_.
          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ._M_impl.super__Vector_impl_data._M_finish) break;
      arg_00 = arg_00 + 1;
    } while (arg_00 != pbVar16);
  }
  std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>::vector
            (&local_138,&local_118.args_);
  parser::missed(&local_158,&local_118);
  paVar6 = local_138.
           super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  paVar5 = local_138.
           super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this = local_138.
         super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pmVar4 = local_158.
           super__Vector_base<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pmVar15 = local_158.
            super__Vector_base<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_138.
  super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->arg2param_).
  super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = paVar6;
  (__return_storage_ptr__->missing_).
  super__Vector_base<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_158.
       super__Vector_base<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->arg2param_).
  super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>.
  _M_impl.super__Vector_impl_data._M_start = this;
  (__return_storage_ptr__->arg2param_).
  super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>.
  _M_impl.super__Vector_impl_data._M_finish = paVar5;
  (__return_storage_ptr__->missing_).
  super__Vector_base<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_158.
       super__Vector_base<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->missing_).
  super__Vector_base<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_158.
       super__Vector_base<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_158.
  super__Vector_base<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.
  super__Vector_base<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>::~vector
            (&local_138);
  std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>::
  ~vector(&local_118.missCand_);
  std::vector<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>::~vector
            (&local_118.args_);
  std::
  _Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
  ::~_Deque_base((_Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                  *)&local_118.pos_.scopes_);
  if (local_118.pos_.posAfterLastMatch_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.pos_.posAfterLastMatch_.stack_.
                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_118.pos_.lastMatch_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.pos_.lastMatch_.stack_.
                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_118.pos_.pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.pos_.pos_.stack_.
                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  for (; this != paVar5; this = this + 1) {
    pcVar2 = (this->match_).stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (((this->match_).stack_.
         super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
         ._M_impl.super__Vector_impl_data._M_start != pcVar2) &&
       (pcVar3 = pcVar2[-1].cur._M_current, pcVar3->type_ == param)) {
      if (this->repeat_ != 0) {
        detail::action_provider<clipp::parameter>::notify_repeated
                  (&(pcVar3->m_).param.super_action_provider<clipp::parameter>,this->index_);
      }
      if (this->blocked_ == true) {
        detail::action_provider<clipp::parameter>::notify_blocked
                  (&(pcVar3->m_).param.super_action_provider<clipp::parameter>,this->index_);
      }
      if (this->conflict_ == true) {
        detail::action_provider<clipp::parameter>::notify_conflict
                  (&(pcVar3->m_).param.super_action_provider<clipp::parameter>,this->index_);
      }
      if (((((this->match_).stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->match_).stack_.
             super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
             ._M_impl.super__Vector_impl_data._M_finish) && (this->blocked_ == false)) &&
          (this->conflict_ == false)) && (bVar8 = parser::arg_mapping::bad_repeat(this), !bVar8)) {
        detail::action_provider<clipp::parameter>::execute_actions
                  (&(pcVar3->m_).param.super_action_provider<clipp::parameter>,&this->arg_);
      }
    }
  }
  for (; pmVar15 != pmVar4; pmVar15 = pmVar15 + 1) {
    if (pmVar15->param_ != (parameter *)0x0) {
      detail::action_provider<clipp::parameter>::notify_missing
                (&pmVar15->param_->super_action_provider<clipp::parameter>,pmVar15->aftIndex_);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_178);
  return __return_storage_ptr__;
}

Assistant:

inline parsing_result
parse(const int argc, char* argv[], const group& cli, arg_index offset = 1)
{
    arg_list args;
    if(offset < argc) args.assign(argv+offset, argv+argc);
    detail::sanitize_args(args);
    return detail::parse_and_execute(args, cli, offset);
}